

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O3

void ** adt_hash_get(adt_hash_t *self,char *pKey)

{
  char *pcVar1;
  adt_hkey_t *paVar2;
  uint uVar3;
  char cVar4;
  
  if (pKey != (char *)0x0 && self != (adt_hash_t *)0x0) {
    cVar4 = *pKey;
    if (cVar4 == '\0') {
      uVar3 = 0;
    }
    else {
      pcVar1 = pKey + 1;
      uVar3 = 0;
      do {
        uVar3 = ((int)cVar4 + uVar3) * 0x401;
        uVar3 = uVar3 >> 6 ^ uVar3;
        cVar4 = *pcVar1;
        pcVar1 = pcVar1 + 1;
      } while (cVar4 != '\0');
      uVar3 = uVar3 * 9;
    }
    paVar2 = adt_hnode_find(self->root,pKey,(uVar3 >> 0xb ^ uVar3) * 0x8001);
    if (paVar2 != (adt_hkey_t *)0x0) {
      return &paVar2->val;
    }
  }
  return (void **)0x0;
}

Assistant:

void**	adt_hash_get(const adt_hash_t *self, const char *pKey){
	if(self && pKey){
		uint32_t u32HashVal = adt_hash_string(pKey);
		adt_hkey_t *hkey = adt_hnode_find(self->root,pKey,u32HashVal);
		if(hkey){
			return &hkey->val;
		}
	}
	return (void**)0;
}